

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int decode_block(jpeg *j,short *data,huffman *hdc,huffman *hac,int b)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int local_54;
  int rs;
  int s;
  int r;
  int t;
  int k;
  int dc;
  int diff;
  int b_local;
  huffman *hac_local;
  huffman *hdc_local;
  short *data_local;
  jpeg *j_local;
  
  iVar1 = decode(j,hdc);
  if (iVar1 < 0) {
    j_local._4_4_ = e("Corrupt JPEG");
  }
  else {
    memset(data,0,0x80);
    if (iVar1 == 0) {
      local_54 = 0;
    }
    else {
      local_54 = extend_receive(j,iVar1);
    }
    local_54 = j->img_comp[b].dc_pred + local_54;
    j->img_comp[b].dc_pred = local_54;
    *data = (short)local_54;
    r = 1;
    do {
      uVar2 = decode(j,hac);
      if ((int)uVar2 < 0) {
        iVar1 = e("Corrupt JPEG");
        return iVar1;
      }
      if ((uVar2 & 0xf) == 0) {
        if (uVar2 != 0xf0) break;
        r = r + 0x10;
      }
      else {
        iVar1 = ((int)uVar2 >> 4) + r;
        iVar3 = extend_receive(j,uVar2 & 0xf);
        r = iVar1 + 1;
        data[dezigzag[iVar1]] = (short)iVar3;
      }
    } while (r < 0x40);
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int decode_block(jpeg *j, short data[64], huffman *hdc, huffman *hac, int b)
{
   int diff,dc,k;
   int t = decode(j, hdc);
   if (t < 0) return e("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) dc;

   // decode AC components, see JPEG spec
   k = 1;
   do {
      int r,s;
      int rs = decode(j, hac);
      if (rs < 0) return e("bad huffman code","Corrupt JPEG");
      s = rs & 15;
      r = rs >> 4;
      if (s == 0) {
         if (rs != 0xf0) break; // end block
         k += 16;
      } else {
         k += r;
         // decode into unzigzag'd location
         data[dezigzag[k++]] = (short) extend_receive(j,s);
      }
   } while (k < 64);
   return 1;
}